

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODRowReader.h
# Opt level: O3

int ZXing::OneD::RowReader::NarrowWideBitPattern(PatternView *view)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  BarAndSpaceI threshold;
  BarAndSpaceI local_c;
  
  local_c = NarrowWideThreshold(view);
  if ((uint)local_c < 0x10000 || local_c.bar == 0) {
LAB_0015b532:
    iVar2 = -1;
  }
  else if ((long)view->_size < 1) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      uVar1 = (&local_c.bar)[(uint)lVar3 & 1];
      if ((uint)uVar1 + (uint)uVar1 < (uint)view->_data[lVar3]) goto LAB_0015b532;
      iVar2 = (uint)(uVar1 < view->_data[lVar3]) + iVar2 * 2;
      lVar3 = lVar3 + 1;
    } while (view->_size != lVar3);
  }
  return iVar2;
}

Assistant:

static int NarrowWideBitPattern(const PatternView& view)
	{
		const auto threshold = NarrowWideThreshold(view);
		if (!threshold.isValid())
			return -1;

		int pattern = 0;
		for (int i = 0; i < view.size(); ++i) {
			if (view[i] > threshold[i] * 2)
				return -1;
			AppendBit(pattern, view[i] > threshold[i]);
		}

		return pattern;
	}